

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.hpp
# Opt level: O0

string_type * __thiscall
toml::detail::serializer<toml::type_config>::operator()[abi_cxx11_
          (serializer<toml::type_config> *this,floating_type f,floating_format_info *fmt,
          source_location *param_4)

{
  bool bVar1;
  uint uVar2;
  _Setprecision _Var3;
  size_type sVar4;
  void *pvVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  ostream *poVar6;
  undefined1 *in_RDX;
  long in_RSI;
  string_type *in_RDI;
  double in_XMM0_Qa;
  string s;
  ostringstream oss;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc80;
  undefined4 in_stack_fffffffffffffc90;
  undefined4 in_stack_fffffffffffffc94;
  serializer<toml::type_config> *in_stack_fffffffffffffc98;
  undefined4 in_stack_fffffffffffffcb0;
  undefined4 in_stack_fffffffffffffcb4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffcb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffcc0;
  locale local_1a8 [8];
  ostringstream local_1a0 [384];
  undefined1 *local_20;
  double local_18;
  
  local_20 = in_RDX;
  local_18 = in_XMM0_Qa;
  std::__cxx11::ostringstream::ostringstream(local_1a0);
  set_locale(in_stack_fffffffffffffc98,
             (ostream *)CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90));
  std::locale::~locale(local_1a8);
  uVar2 = std::isnan(local_18);
  if ((uVar2 & 1) == 0) {
    uVar2 = std::isinf(local_18);
    if ((uVar2 & 1) == 0) {
      switch(*local_20) {
      case 0:
        if (*(long *)(local_20 + 8) != 0) {
          _Var3 = std::setprecision(*(int *)(local_20 + 8));
          std::operator<<((ostream *)local_1a0,_Var3);
        }
        std::ostream::operator<<(local_1a0,local_18);
        std::__cxx11::ostringstream::str();
        sVar4 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                ::find(in_stack_fffffffffffffcc0,(char)((ulong)in_stack_fffffffffffffcb8 >> 0x38),
                       CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0));
        if (((sVar4 == 0xffffffffffffffff) &&
            (sVar4 = CLI::std::__cxx11::
                     basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                               (in_stack_fffffffffffffcc0,
                                (char)((ulong)in_stack_fffffffffffffcb8 >> 0x38),
                                CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0)),
            sVar4 == 0xffffffffffffffff)) &&
           (sVar4 = CLI::std::__cxx11::
                    basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                              (in_stack_fffffffffffffcc0,
                               (char)((ulong)in_stack_fffffffffffffcb8 >> 0x38),
                               CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0)),
           sVar4 == 0xffffffffffffffff)) {
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          operator+=(in_stack_fffffffffffffc80,(char *)in_stack_fffffffffffffc78);
        }
        if (((*(byte *)(in_RSI + 0x14) & 1) != 0) &&
           (bVar1 = CLI::std::__cxx11::
                    basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               0x76c36c), !bVar1)) {
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          operator+=(in_stack_fffffffffffffc80,(char)((ulong)in_stack_fffffffffffffc78 >> 0x38));
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          operator+=(in_stack_fffffffffffffc80,in_stack_fffffffffffffc78);
        }
        std::__cxx11::string::string
                  (in_stack_fffffffffffffcc0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffcb8);
        string_conv<std::__cxx11::string,char,std::char_traits<char>,std::allocator<char>>
                  (in_stack_fffffffffffffcb8);
        std::__cxx11::string::~string(in_stack_fffffffffffffc80);
        std::__cxx11::string::~string(in_stack_fffffffffffffc80);
        break;
      case 1:
        if (*(long *)(local_20 + 8) != 0) {
          _Var3 = std::setprecision(*(int *)(local_20 + 8));
          std::operator<<((ostream *)local_1a0,_Var3);
        }
        pvVar5 = (void *)std::ostream::operator<<(local_1a0,std::fixed);
        std::ostream::operator<<(pvVar5,local_18);
        if (((*(byte *)(in_RSI + 0x14) & 1) != 0) &&
           (bVar1 = CLI::std::__cxx11::
                    basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               0x76c4bd), !bVar1)) {
          in_stack_fffffffffffffcb8 =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               std::operator<<((ostream *)local_1a0,'_');
          std::operator<<((ostream *)in_stack_fffffffffffffcb8,(string *)(local_20 + 0x10));
        }
        std::__cxx11::ostringstream::str();
        string_conv<std::__cxx11::string,char,std::char_traits<char>,std::allocator<char>>
                  (in_stack_fffffffffffffcb8);
        std::__cxx11::string::~string(in_stack_fffffffffffffc80);
        break;
      case 2:
        if (*(long *)(local_20 + 8) != 0) {
          _Var3 = std::setprecision(*(int *)(local_20 + 8));
          std::operator<<((ostream *)local_1a0,_Var3);
        }
        pvVar5 = (void *)std::ostream::operator<<(local_1a0,std::scientific);
        std::ostream::operator<<(pvVar5,local_18);
        if (((*(byte *)(in_RSI + 0x14) & 1) != 0) &&
           (bVar1 = CLI::std::__cxx11::
                    basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               0x76c5f6), !bVar1)) {
          poVar6 = std::operator<<((ostream *)local_1a0,'_');
          std::operator<<(poVar6,(string *)(local_20 + 0x10));
        }
        std::__cxx11::ostringstream::str();
        string_conv<std::__cxx11::string,char,std::char_traits<char>,std::allocator<char>>
                  (in_stack_fffffffffffffcb8);
        std::__cxx11::string::~string(in_stack_fffffffffffffc80);
        break;
      case 3:
        if ((*(byte *)(in_RSI + 0x13) & 1) == 0) {
          _Var3 = std::setprecision(0x11);
          poVar6 = std::operator<<((ostream *)local_1a0,_Var3);
          this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    std::ostream::operator<<(poVar6,std::scientific);
          std::ostream::operator<<(this_00,local_18);
          std::__cxx11::ostringstream::str();
          string_conv<std::__cxx11::string,char,std::char_traits<char>,std::allocator<char>>
                    (in_stack_fffffffffffffcb8);
          std::__cxx11::string::~string(this_00);
        }
        else {
          pvVar5 = (void *)std::ostream::operator<<(local_1a0,std::hexfloat);
          std::ostream::operator<<(pvVar5,local_18);
          std::__cxx11::ostringstream::str();
          string_conv<std::__cxx11::string,char,std::char_traits<char>,std::allocator<char>>
                    (in_stack_fffffffffffffcb8);
          std::__cxx11::string::~string(in_stack_fffffffffffffc80);
        }
        break;
      default:
        if (((*(byte *)(in_RSI + 0x14) & 1) != 0) &&
           (bVar1 = CLI::std::__cxx11::
                    basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               0x76c835), !bVar1)) {
          poVar6 = std::operator<<((ostream *)local_1a0,'_');
          std::operator<<(poVar6,(string *)(local_20 + 0x10));
        }
        std::__cxx11::ostringstream::str();
        string_conv<std::__cxx11::string,char,std::char_traits<char>,std::allocator<char>>
                  (in_stack_fffffffffffffcb8);
        std::__cxx11::string::~string(in_stack_fffffffffffffc80);
      }
    }
    else {
      bVar1 = std::signbit(local_18);
      if (bVar1) {
        std::operator<<((ostream *)local_1a0,'-');
      }
      std::operator<<((ostream *)local_1a0,"inf");
      if (((*(byte *)(in_RSI + 0x14) & 1) != 0) &&
         (bVar1 = CLI::std::__cxx11::
                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             0x76c182), !bVar1)) {
        std::operator<<((ostream *)local_1a0,'_');
        std::operator<<((ostream *)local_1a0,(string *)(local_20 + 0x10));
      }
      std::__cxx11::ostringstream::str();
      string_conv<std::__cxx11::string,char,std::char_traits<char>,std::allocator<char>>
                (in_stack_fffffffffffffcb8);
      std::__cxx11::string::~string(in_stack_fffffffffffffc80);
    }
  }
  else {
    bVar1 = std::signbit(local_18);
    if (bVar1) {
      std::operator<<((ostream *)local_1a0,'-');
    }
    std::operator<<((ostream *)local_1a0,"nan");
    if (((*(byte *)(in_RSI + 0x14) & 1) != 0) &&
       (bVar1 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                ::empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        0x76c058), !bVar1)) {
      std::operator<<((ostream *)local_1a0,'_');
      std::operator<<((ostream *)local_1a0,(string *)(local_20 + 0x10));
    }
    std::__cxx11::ostringstream::str();
    string_conv<std::__cxx11::string,char,std::char_traits<char>,std::allocator<char>>
              (in_stack_fffffffffffffcb8);
    std::__cxx11::string::~string(in_stack_fffffffffffffc80);
  }
  std::__cxx11::ostringstream::~ostringstream(local_1a0);
  return in_RDI;
}

Assistant:

string_type operator()(const floating_type f, const floating_format_info& fmt, const source_location&) // {{{
    {
        using std::isnan;
        using std::isinf;
        using std::signbit;

        std::ostringstream oss;
        this->set_locale(oss);

        if(isnan(f))
        {
            if(signbit(f))
            {
                oss << '-';
            }
            oss << "nan";
            if(this->spec_.ext_num_suffix && ! fmt.suffix.empty())
            {
                oss << '_';
                oss << fmt.suffix;
            }
            return string_conv<string_type>(oss.str());
        }

        if(isinf(f))
        {
            if(signbit(f))
            {
                oss << '-';
            }
            oss << "inf";
            if(this->spec_.ext_num_suffix && ! fmt.suffix.empty())
            {
                oss << '_';
                oss << fmt.suffix;
            }
            return string_conv<string_type>(oss.str());
        }

        switch(fmt.fmt)
        {
            case floating_format::defaultfloat:
            {
                if(fmt.prec != 0)
                {
                    oss << std::setprecision(static_cast<int>(fmt.prec));
                }
                oss << f;
                // since defaultfloat may omit point, we need to add it
                std::string s = oss.str();
                if (s.find('.') == std::string::npos &&
                    s.find('e') == std::string::npos &&
                    s.find('E') == std::string::npos )
                {
                    s += ".0";
                }
                if(this->spec_.ext_num_suffix && ! fmt.suffix.empty())
                {
                    s += '_';
                    s += fmt.suffix;
                }
                return string_conv<string_type>(s);
            }
            case floating_format::fixed:
            {
                if(fmt.prec != 0)
                {
                    oss << std::setprecision(static_cast<int>(fmt.prec));
                }
                oss << std::fixed << f;
                if(this->spec_.ext_num_suffix && ! fmt.suffix.empty())
                {
                    oss << '_' << fmt.suffix;
                }
                return string_conv<string_type>(oss.str());
            }
            case floating_format::scientific:
            {
                if(fmt.prec != 0)
                {
                    oss << std::setprecision(static_cast<int>(fmt.prec));
                }
                oss << std::scientific << f;
                if(this->spec_.ext_num_suffix && ! fmt.suffix.empty())
                {
                    oss << '_' << fmt.suffix;
                }
                return string_conv<string_type>(oss.str());
            }
            case floating_format::hex:
            {
                if(this->spec_.ext_hex_float)
                {
                    oss << std::hexfloat << f;
                    // suffix is only for decimal numbers.
                    return string_conv<string_type>(oss.str());
                }
                else // no hex allowed. output with max precision.
                {
                    oss << std::setprecision(std::numeric_limits<floating_type>::max_digits10)
                        << std::scientific << f;
                    // suffix is only for decimal numbers.
                    return string_conv<string_type>(oss.str());
                }
            }
            default:
            {
                if(this->spec_.ext_num_suffix && ! fmt.suffix.empty())
                {
                    oss << '_' << fmt.suffix;
                }
                return string_conv<string_type>(oss.str());
            }
        }
    }